

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Address.cpp
# Opt level: O3

bool __thiscall Network::Address::Ethernet::asText(Ethernet *this,String *textualValue)

{
  int iVar1;
  int64 iVar2;
  bool bVar3;
  long lVar4;
  bool bVar5;
  int consumed;
  String a;
  String rawBytes;
  String local_80;
  String local_70;
  String local_60;
  String local_50;
  String local_40;
  
  Bstrlib::String::String(&local_80," \t\v\f\r\n",7);
  iVar1 = local_80.super_tagbstring.slen;
  Bstrlib::String::String(&local_70,textualValue);
  if ((iVar1 != 0) && (local_80.super_tagbstring.slen != 0)) {
    Bstrlib::String::rightTrim(&local_70,&local_80);
    Bstrlib::String::leftTrim(&local_70,&local_80);
  }
  Bstrlib::String::String(&local_40,":");
  Bstrlib::String::String(&local_50,"");
  Bstrlib::String::replacedAll(&local_60,&local_70,&local_40);
  Bstrlib::String::~String(&local_50);
  Bstrlib::String::~String(&local_40);
  Bstrlib::String::~String(&local_70);
  Bstrlib::String::~String(&local_80);
  if ((uint)local_60.super_tagbstring.slen < 0xc) {
    bVar3 = false;
  }
  else {
    lVar4 = -5;
    do {
      local_80.super_tagbstring.mlen = 0;
      Bstrlib::String::splitAt(&local_70,(int)&local_60);
      iVar2 = Bstrlib::String::parseInt(&local_70,0x10,(int *)&local_80);
      this->address[lVar4 + 5] = (uint8)iVar2;
      Bstrlib::String::~String(&local_70);
      bVar3 = 1 < local_80.super_tagbstring.mlen;
      if (local_80.super_tagbstring.mlen < 2) break;
      bVar5 = lVar4 != 0;
      lVar4 = lVar4 + 1;
    } while (bVar5);
  }
  Bstrlib::String::~String(&local_60);
  return bVar3;
}

Assistant:

bool Ethernet::asText(const String & textualValue)
        {
            String rawBytes = textualValue.Trimmed().replacedAll(":", "");
            if ((size_t)rawBytes.getLength() < ArrSz(address) * 2) return false;
            for (size_t i = 0; i < ArrSz(address); i++)
            {
                int consumed = 0;
                address[i] = (uint8)rawBytes.splitAt(2).parseInt(16, &consumed);
                if (consumed < 2) return false;
            }
            return true;
        }